

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

int co_poll_inner(stCoEpoll_t *ctx,pollfd *fds,nfds_t nfds,int timeout,poll_pfn_t pollfunc)

{
  uint *puVar1;
  stTimeoutItemLink_t *psVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  stCoRoutine_t *psVar6;
  stTimeoutItem_t *apItem;
  stTimeoutItem_t *psVar7;
  stPollItem_t *__s;
  int *piVar8;
  unsigned_long_long allNow;
  nfds_t i;
  long lVar9;
  long lVar10;
  long lVar11;
  nfds_t nVar12;
  long in_FS_OFFSET;
  bool bVar13;
  stPollItem_t arr [2];
  
  if (timeout == 0) {
    iVar5 = (*pollfunc)(fds,nfds,0);
    return iVar5;
  }
  uVar3 = 0x7fffffff;
  if ((uint)timeout < 0x7fffffff) {
    uVar3 = timeout;
  }
  iVar5 = ctx->iEpollFd;
  psVar6 = GetCurrThreadCo();
  apItem = (stTimeoutItem_t *)calloc(1,0x68);
  *(int *)((long)&apItem[1].ullExpireTime + 4) = iVar5;
  psVar7 = (stTimeoutItem_t *)calloc(nfds,8);
  apItem[1].pPrev = psVar7;
  apItem[1].pNext = (stTimeoutItem_t *)nfds;
  if ((nfds < 2) && (psVar6->cIsShareStack == '\0')) {
    __s = arr;
    apItem[1].pLink = (stTimeoutItemLink_t *)__s;
  }
  else {
    __s = (stPollItem_t *)malloc(nfds * 0x60);
    apItem[1].pLink = (stTimeoutItemLink_t *)__s;
  }
  lVar11 = 0;
  memset(__s,0,nfds * 0x60);
  apItem->pfnProcess = OnPollProcessEvent;
  apItem->pArg = *(void **)(*(long *)(in_FS_OFFSET + -0x10) + -8 +
                           (long)*(int *)(*(long *)(in_FS_OFFSET + -0x10) + 0x400) * 8);
  lVar9 = 0x50;
  lVar10 = 0;
  nVar12 = nfds;
  do {
    bVar13 = nVar12 == 0;
    nVar12 = nVar12 - 1;
    if (bVar13) {
      allNow = GetTickMS();
      apItem->ullExpireTime = uVar3 + allNow;
      iVar4 = AddTimeout(ctx->pTimeout,apItem,allNow);
      if (iVar4 == 0) {
        *(long *)(in_FS_OFFSET + -8) = *(long *)(in_FS_OFFSET + -8) + lVar10;
        co_yield_env(*(stCoRoutineEnv_t **)(in_FS_OFFSET + -0x10));
        *(long *)(in_FS_OFFSET + -8) = *(long *)(in_FS_OFFSET + -8) - lVar10;
        iVar4 = *(int *)&apItem[1].pfnPrepare;
      }
      else {
        piVar8 = __errno_location();
        *piVar8 = 0x16;
        iVar4 = -1;
      }
      RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>(apItem);
      lVar9 = 0x50;
      for (nVar12 = 0; nfds != nVar12; nVar12 = nVar12 + 1) {
        if (-1 < fds[nVar12].fd) {
          co_epoll_ctl(iVar5,2,fds[nVar12].fd,
                       (epoll_event *)((long)&(apItem[1].pLink)->head + lVar9));
        }
        fds[nVar12].revents = *(short *)((long)&(apItem[1].pPrev)->pPrev + nVar12 * 8 + 6);
        lVar9 = lVar9 + 0x60;
      }
      if ((stPollItem_t *)apItem[1].pLink != arr) {
        free((stPollItem_t *)apItem[1].pLink);
        apItem[1].pLink = (stTimeoutItemLink_t *)0x0;
      }
      free(apItem[1].pPrev);
      free(apItem);
      return iVar4;
    }
    psVar2 = apItem[1].pLink;
    *(long *)((long)&psVar2[-1].head + lVar9) = (long)&(apItem[1].pPrev)->pPrev + lVar11;
    *(stTimeoutItem_t **)((long)psVar2 + lVar9 + -8) = apItem;
    *(code **)((long)&psVar2[-3].head + lVar9) = OnPollPreparePfn;
    if (-1 < *(int *)((long)&fds->fd + lVar11)) {
      puVar1 = (uint *)((long)&psVar2->head + lVar9);
      *(uint **)(puVar1 + 1) = puVar1 + -0x14;
      *puVar1 = *(ushort *)((long)&fds->events + lVar11) & 0x15d;
      iVar4 = co_epoll_ctl(iVar5,1,*(int *)((long)&fds->fd + lVar11),
                           (epoll_event *)((long)&psVar2->head + lVar9));
      if ((((iVar4 < 0) && (piVar8 = __errno_location(), pollfunc != (poll_pfn_t)0x0)) &&
          (nfds == 1)) && (*piVar8 == 1)) {
        if ((stPollItem_t *)apItem[1].pLink != arr) {
          free((stPollItem_t *)apItem[1].pLink);
          apItem[1].pLink = (stTimeoutItemLink_t *)0x0;
        }
        free(apItem[1].pPrev);
        free(apItem);
        iVar5 = (*pollfunc)(fds,1,uVar3);
        return iVar5;
      }
      lVar10 = lVar10 + 1;
    }
    lVar9 = lVar9 + 0x60;
    lVar11 = lVar11 + 8;
  } while( true );
}

Assistant:

int co_poll_inner( stCoEpoll_t *ctx,struct pollfd fds[], nfds_t nfds, int timeout, poll_pfn_t pollfunc)
{
    if (timeout == 0)
	{
		return pollfunc(fds, nfds, timeout);
	}
	if (timeout < 0)
	{
		timeout = INT_MAX;
	}
	int epfd = ctx->iEpollFd;
	stCoRoutine_t* self = co_self();

	//1.struct change
	stPoll_t& arg = *((stPoll_t*)malloc(sizeof(stPoll_t)));
	memset( &arg,0,sizeof(arg) );

	arg.iEpollFd = epfd;
	arg.fds = (pollfd*)calloc(nfds, sizeof(pollfd));
	arg.nfds = nfds;

	stPollItem_t arr[2];
	if( nfds < sizeof(arr) / sizeof(arr[0]) && !self->cIsShareStack)
	{
		arg.pPollItems = arr;
	}	
	else
	{
		arg.pPollItems = (stPollItem_t*)malloc( nfds * sizeof( stPollItem_t ) );
	}
	memset( arg.pPollItems,0,nfds * sizeof(stPollItem_t) );

	arg.pfnProcess = OnPollProcessEvent;
	arg.pArg = GetCurrCo( co_get_curr_thread_env() );
	
	size_t num_active = 0;
	//2. add epoll
	for(nfds_t i=0;i<nfds;i++)
	{
		arg.pPollItems[i].pSelf = arg.fds + i;
		arg.pPollItems[i].pPoll = &arg;

		arg.pPollItems[i].pfnPrepare = OnPollPreparePfn;
		struct epoll_event &ev = arg.pPollItems[i].stEvent;

		if( fds[i].fd > -1 )
		{
			ev.data.ptr = arg.pPollItems + i;
			ev.events = PollEvent2Epoll( fds[i].events );

			int ret = co_epoll_ctl( epfd,EPOLL_CTL_ADD, fds[i].fd, &ev );
			if (ret < 0 && errno == EPERM && nfds == 1 && pollfunc != NULL)
			{
				if( arg.pPollItems != arr )
				{
					free( arg.pPollItems );
					arg.pPollItems = NULL;
				}
				free(arg.fds);
				free(&arg);
				return pollfunc(fds, nfds, timeout);
			}
			num_active++;
		}
		//if fail,the timeout would work
	}

	//3.add timeout

	unsigned long long now = GetTickMS();
	arg.ullExpireTime = now + timeout;
	int ret = AddTimeout( ctx->pTimeout,&arg,now );
	int iRaiseCnt = 0;
	if( ret != 0 && ret!=-1){
		co_log_err("CO_ERR: AddTimeout ret %d now %lld timeout %d arg.ullExpireTime %lld",
				ret,now,timeout,arg.ullExpireTime);
		errno = EINVAL;
		iRaiseCnt = -1;

	}
    else
	{
		_num_co_routines_active += num_active;
		co_yield_env( co_get_curr_thread_env() );
		_num_co_routines_active -= num_active;
		iRaiseCnt = arg.iRaiseCnt;
	}

    {
		//clear epoll status and memory
		RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>( &arg );
		for(nfds_t i = 0;i < nfds;i++)
		{
			int fd = fds[i].fd;
			if( fd > -1 )
			{
				co_epoll_ctl( epfd,EPOLL_CTL_DEL,fd,&arg.pPollItems[i].stEvent );
			}
			fds[i].revents = arg.fds[i].revents;
		}


		if( arg.pPollItems != arr )
		{
			free( arg.pPollItems );
			arg.pPollItems = NULL;
		}

		free(arg.fds);
		free(&arg);
	}

	return iRaiseCnt;
}